

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpASIOListener.cpp
# Opt level: O0

void __thiscall mognetwork::TcpASIOListener::~TcpASIOListener(TcpASIOListener *this)

{
  long *plVar1;
  _List_node_base *p_Var2;
  Selector *in_RDI;
  
  in_RDI->_vptr_Selector = (_func_int **)&PTR__TcpASIOListener_00126b60;
  if (in_RDI[1].m_writeUpdated.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
      super__List_node_base._M_prev == (_List_node_base *)0x0) {
    if ((in_RDI[1].m_writeSockets.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
         _M_size != 0) &&
       (plVar1 = (long *)in_RDI[1].m_writeSockets.super__List_base<int,_std::allocator<int>_>.
                         _M_impl._M_node._M_size, plVar1 != (long *)0x0)) {
      (**(code **)(*plVar1 + 8))();
    }
    if ((in_RDI[1].m_writeSockets.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
         super__List_node_base._M_prev != (_List_node_base *)0x0) &&
       (p_Var2 = in_RDI[1].m_writeSockets.super__List_base<int,_std::allocator<int>_>._M_impl.
                 _M_node.super__List_node_base._M_prev, p_Var2 != (_List_node_base *)0x0)) {
      std::__cxx11::list<mognetwork::TcpSocket_*,_std::allocator<mognetwork::TcpSocket_*>_>::~list
                ((list<mognetwork::TcpSocket_*,_std::allocator<mognetwork::TcpSocket_*>_> *)0x11b2ac
                );
      operator_delete(p_Var2);
    }
  }
  close(*(int *)&in_RDI[1].m_readUpdated.super__List_base<int,_std::allocator<int>_>._M_impl._M_node
                 .super__List_node_base._M_next);
  close(*(int *)((long)&in_RDI[1].m_readUpdated.super__List_base<int,_std::allocator<int>_>._M_impl.
                        _M_node.super__List_node_base._M_next + 4));
  p_Var2 = in_RDI[1].m_writeSockets.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var2 != (_List_node_base *)0x0) {
    (*(code *)p_Var2->_M_next->_M_prev)();
  }
  Selector::~Selector(in_RDI);
  std::__cxx11::
  list<mognetwork::ITcpASIOListenerHandler_*,_std::allocator<mognetwork::ITcpASIOListenerHandler_*>_>
  ::~list((list<mognetwork::ITcpASIOListenerHandler_*,_std::allocator<mognetwork::ITcpASIOListenerHandler_*>_>
           *)0x11b342);
  IRunnable::~IRunnable((IRunnable *)in_RDI);
  return;
}

Assistant:

TcpASIOListener::~TcpASIOListener()
  {
    if (m_server == NULL)
      {
	if (m_mutex != NULL)
	  delete (m_mutex);
	if (m_socketList != NULL)
	  delete (m_socketList);
      }
#ifndef OS_WINDOWS
    ::close(m_pipefd[0]);
    ::close(m_pipefd[1]);
#else
	_close(m_pipefd[0]);
	_close(m_pipefd[1]);
#endif // !OS_WINDOWS
    delete m_thread;
  }